

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_or_prepare_insert_soo<char_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,char **key)

{
  bool bVar1;
  slot_type *slot;
  basic_string_view<char,_std::char_traits<char>_> *ts;
  size_t sVar2;
  hasher *this_00;
  CommonFields *pCVar3;
  bool local_89;
  iterator local_88;
  string_view local_78;
  size_t local_68;
  size_t index;
  iterator local_58;
  EqualElement<const_char_*> local_48;
  bool local_31;
  iterator local_30;
  HashtablezInfoHandle local_19;
  char **ppcStack_18;
  HashtablezInfoHandle infoz;
  char **key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_local;
  
  ppcStack_18 = key;
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)this);
  if (bVar1) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::try_sample_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this);
    bVar1 = HashtablezInfoHandle::IsSampled(&local_19);
    if (!bVar1) {
      pCVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::common((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)this);
      CommonFields::set_full_soo(pCVar3);
      local_30 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)this);
      local_31 = true;
      std::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
      ::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool,_true>
                (__return_storage_ptr__,&local_30,&local_31);
      return __return_storage_ptr__;
    }
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::resize_with_soo_infoz
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)this);
  }
  else {
    local_48.rhs = ppcStack_18;
    local_48.eq = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::eq_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>::EqualElement<char_const*>,std::basic_string_view<char,std::char_traits<char>>&,absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>>
                      (&local_48,ts);
    if (bVar1) {
      local_58 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)this);
      index._7_1_ = 0;
      std::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
      ::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool,_true>
                (__return_storage_ptr__,&local_58,(bool *)((long)&index + 7));
      return __return_storage_ptr__;
    }
    sVar2 = SooCapacity();
    sVar2 = NextCapacity(sVar2);
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::resize((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)this,sVar2);
  }
  this_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::hash_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,*ppcStack_18);
  sVar2 = StringHash::operator()(this_00,local_78);
  pCVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::common((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)this);
  local_68 = PrepareInsertAfterSoo(sVar2,0x10,pCVar3);
  local_88 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)this,local_68);
  local_89 = true;
  std::
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  ::
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool,_true>
            (__return_storage_ptr__,&local_88,&local_89);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }